

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O3

int mbedtls_x509_crt_verify_info(char *buf,size_t size,char *prefix,uint32_t flags)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  x509_crt_verify_string *pxVar4;
  char *pcVar5;
  size_t __maxlen;
  bool bVar6;
  
  pxVar4 = x509_crt_verify_strings;
  pcVar5 = "The certificate validity has expired";
  __maxlen = size;
  do {
    uVar2 = pxVar4->code;
    if ((uVar2 & flags) != 0) {
      uVar1 = snprintf(buf,__maxlen,"%s%s\n",prefix,pcVar5);
      if ((int)uVar1 < 0) {
        return -0x2980;
      }
      uVar3 = (ulong)uVar1;
      bVar6 = __maxlen < uVar3;
      __maxlen = __maxlen - uVar3;
      if (bVar6 || __maxlen == 0) {
        return -0x2980;
      }
      buf = buf + uVar3;
      flags = flags ^ uVar2;
    }
    pcVar5 = pxVar4[1].string;
    pxVar4 = pxVar4 + 1;
  } while (pcVar5 != (char *)0x0);
  if (flags != 0) {
    uVar2 = snprintf(buf,__maxlen,"%sUnknown reason (this should not happen)\n",prefix);
    if ((int)uVar2 < 0) {
      return -0x2980;
    }
    bVar6 = __maxlen < uVar2;
    __maxlen = __maxlen - uVar2;
    if (bVar6 || __maxlen == 0) {
      return -0x2980;
    }
  }
  return (int)size - (int)__maxlen;
}

Assistant:

int mbedtls_x509_crt_verify_info(char *buf, size_t size, const char *prefix,
                                 uint32_t flags)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const struct x509_crt_verify_string *cur;
    char *p = buf;
    size_t n = size;

    for (cur = x509_crt_verify_strings; cur->string != NULL; cur++) {
        if ((flags & cur->code) == 0) {
            continue;
        }

        ret = mbedtls_snprintf(p, n, "%s%s\n", prefix, cur->string);
        MBEDTLS_X509_SAFE_SNPRINTF;
        flags ^= cur->code;
    }

    if (flags != 0) {
        ret = mbedtls_snprintf(p, n, "%sUnknown reason "
                                     "(this should not happen)\n", prefix);
        MBEDTLS_X509_SAFE_SNPRINTF;
    }

    return (int) (size - n);
}